

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O0

uint32_t CnvExtWrite(NewConverter *cnvData,UConverterStaticData *staticData,UNewDataMemory *pData,
                    int32_t tableType)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  size_t sVar5;
  undefined2 *puVar6;
  undefined4 *puVar7;
  undefined1 *puVar8;
  void *pvVar9;
  undefined1 local_f0;
  undefined1 local_ef;
  _MBCSHeader header;
  int32_t indexes [32];
  int local_3c;
  uint local_38;
  int32_t headerSize;
  int32_t top;
  int32_t length;
  CnvExtData *extData;
  int32_t tableType_local;
  UNewDataMemory *pData_local;
  UConverterStaticData *staticData_local;
  NewConverter *cnvData_local;
  
  memset(&header.options,0,0x80);
  if ((tableType & 1U) == 0) {
    memset(&local_f0,0,0x28);
    sVar5 = strlen((char *)(cnvData[1].close + 0x20424));
    local_3c = (int)sVar5;
    while (headerSize = local_3c + 1, (headerSize & 3U) != 0) {
      cnvData[1].close[(long)headerSize + 0x20424] = (_func_void_NewConverter_ptr)0x0;
      local_3c = headerSize;
    }
    local_3c = local_3c + 0x21;
    local_f0 = 4;
    local_ef = 2;
    header.offsetFromUTable = local_3c * 0x100 | 0xe;
    udata_writeBlock(pData,&local_f0,0x20);
    udata_writeBlock(pData,cnvData[1].close + 0x20424,headerSize);
  }
  else {
    local_3c = 0;
  }
  header.options = 0x20;
  header.fullStage2Length = 0x80;
  iVar2 = utm_countItems((UToolMemory *)cnvData[1].isValid);
  iVar3 = utm_countItems((UToolMemory *)cnvData[1].addTable);
  headerSize = utm_countItems((UToolMemory *)cnvData[1].write);
  local_38 = headerSize * 2 + iVar3 * 2 + iVar2 * 4 + 0x80;
  if ((local_38 & 3) != 0) {
    puVar6 = (undefined2 *)utm_alloc((UToolMemory *)cnvData[1].write);
    *puVar6 = 0;
    puVar7 = (undefined4 *)utm_alloc((UToolMemory *)cnvData[2].close);
    *puVar7 = 0;
    headerSize = headerSize + 1;
    local_38 = local_38 + 2;
  }
  iVar1 = headerSize;
  iVar4 = headerSize * 4;
  headerSize = utm_countItems((UToolMemory *)cnvData[2].isValid);
  local_38 = headerSize + iVar4 + local_38;
  if ((local_38 & 1) != 0) {
    puVar8 = (undefined1 *)utm_alloc((UToolMemory *)cnvData[2].isValid);
    *puVar8 = 0;
    headerSize = headerSize + 1;
    local_38 = local_38 + 1;
  }
  local_38 = *(int *)&cnvData[0x7002].write * 2 +
             (*(int *)((long)&cnvData[0x7002].addTable + 4) + *(int *)&cnvData[0x7002].addTable) * 2
             + local_38;
  if ((local_38 & 3) != 0) {
    iVar4 = *(int *)&cnvData[0x7002].write;
    *(int *)&cnvData[0x7002].write = iVar4 + 1;
    *(undefined2 *)((long)&cnvData[0x1002].addTable + (long)iVar4 * 2) = 0;
    local_38 = local_38 + 2;
  }
  iVar4 = *(int *)((long)&cnvData[0x7002].write + 4) * 4 + local_38;
  udata_writeBlock(pData,&header.options,0x80);
  pvVar9 = utm_getStart((UToolMemory *)cnvData[1].isValid);
  udata_writeBlock(pData,pvVar9,iVar2 << 2);
  pvVar9 = utm_getStart((UToolMemory *)cnvData[1].addTable);
  udata_writeBlock(pData,pvVar9,iVar3 << 1);
  pvVar9 = utm_getStart((UToolMemory *)cnvData[1].write);
  udata_writeBlock(pData,pvVar9,iVar1 << 1);
  pvVar9 = utm_getStart((UToolMemory *)cnvData[2].close);
  udata_writeBlock(pData,pvVar9,iVar1 << 2);
  pvVar9 = utm_getStart((UToolMemory *)cnvData[2].isValid);
  udata_writeBlock(pData,pvVar9,headerSize);
  udata_writeBlock(pData,&cnvData[2].addTable,*(int *)&cnvData[0x7002].addTable << 1);
  udata_writeBlock(pData,&cnvData[0x46].addTable,*(int *)((long)&cnvData[0x7002].addTable + 4) << 1)
  ;
  udata_writeBlock(pData,&cnvData[0x1002].addTable,*(int *)&cnvData[0x7002].write << 1);
  udata_writeBlock(pData,&cnvData[0x5002].addTable,*(int *)((long)&cnvData[0x7002].write + 4) << 2);
  if (VERBOSE != '\0') {
    printf("size of extension data: %ld\n",(long)iVar4);
  }
  return local_3c + iVar4;
}

Assistant:

static uint32_t
CnvExtWrite(NewConverter *cnvData, const UConverterStaticData *staticData,
            UNewDataMemory *pData, int32_t tableType) {
    CnvExtData *extData=(CnvExtData *)cnvData;
    int32_t length, top, headerSize;

    int32_t indexes[UCNV_EXT_INDEXES_MIN_LENGTH]={ 0 };

    if(tableType&TABLE_BASE) {
        headerSize=0;
    } else {
        _MBCSHeader header={ { 0, 0, 0, 0 }, 0, 0, 0, 0, 0, 0, 0 };

        /* write the header and base table name for an extension-only table */
        length=(int32_t)uprv_strlen(extData->ucm->baseName)+1;
        while(length&3) {
            /* add padding */
            extData->ucm->baseName[length++]=0;
        }

        headerSize=MBCS_HEADER_V4_LENGTH*4+length;

        /* fill the header */
        header.version[0]=4;
        header.version[1]=2;
        header.flags=(uint32_t)((headerSize<<8)|MBCS_OUTPUT_EXT_ONLY);

        /* write the header and the base table name */
        udata_writeBlock(pData, &header, MBCS_HEADER_V4_LENGTH*4);
        udata_writeBlock(pData, extData->ucm->baseName, length);
    }

    /* fill indexes[] - offsets/indexes are in units of the target array */
    top=0;

    indexes[UCNV_EXT_INDEXES_LENGTH]=length=UCNV_EXT_INDEXES_MIN_LENGTH;
    top+=length*4;

    indexes[UCNV_EXT_TO_U_INDEX]=top;
    indexes[UCNV_EXT_TO_U_LENGTH]=length=utm_countItems(extData->toUTable);
    top+=length*4;

    indexes[UCNV_EXT_TO_U_UCHARS_INDEX]=top;
    indexes[UCNV_EXT_TO_U_UCHARS_LENGTH]=length=utm_countItems(extData->toUUChars);
    top+=length*2;

    indexes[UCNV_EXT_FROM_U_UCHARS_INDEX]=top;
    length=utm_countItems(extData->fromUTableUChars);
    top+=length*2;

    if(top&3) {
        /* add padding */
        *((UChar *)utm_alloc(extData->fromUTableUChars))=0;
        *((uint32_t *)utm_alloc(extData->fromUTableValues))=0;
        ++length;
        top+=2;
    }
    indexes[UCNV_EXT_FROM_U_LENGTH]=length;

    indexes[UCNV_EXT_FROM_U_VALUES_INDEX]=top;
    top+=length*4;

    indexes[UCNV_EXT_FROM_U_BYTES_INDEX]=top;
    length=utm_countItems(extData->fromUBytes);
    top+=length;

    if(top&1) {
        /* add padding */
        *((uint8_t *)utm_alloc(extData->fromUBytes))=0;
        ++length;
        ++top;
    }
    indexes[UCNV_EXT_FROM_U_BYTES_LENGTH]=length;

    indexes[UCNV_EXT_FROM_U_STAGE_12_INDEX]=top;
    indexes[UCNV_EXT_FROM_U_STAGE_1_LENGTH]=length=extData->stage1Top;
    indexes[UCNV_EXT_FROM_U_STAGE_12_LENGTH]=length+=extData->stage2Top;
    top+=length*2;

    indexes[UCNV_EXT_FROM_U_STAGE_3_INDEX]=top;
    length=extData->stage3Top;
    top+=length*2;

    if(top&3) {
        /* add padding */
        extData->stage3[extData->stage3Top++]=0;
        ++length;
        top+=2;
    }
    indexes[UCNV_EXT_FROM_U_STAGE_3_LENGTH]=length;

    indexes[UCNV_EXT_FROM_U_STAGE_3B_INDEX]=top;
    indexes[UCNV_EXT_FROM_U_STAGE_3B_LENGTH]=length=extData->stage3bTop;
    top+=length*4;

    indexes[UCNV_EXT_SIZE]=top;

    /* statistics */
    indexes[UCNV_EXT_COUNT_BYTES]=
        (extData->maxInBytes<<16)|
        (extData->maxOutBytes<<8)|
        extData->maxBytesPerUChar;
    indexes[UCNV_EXT_COUNT_UCHARS]=
        (extData->maxInUChars<<16)|
        (extData->maxOutUChars<<8)|
        extData->maxUCharsPerByte;

    indexes[UCNV_EXT_FLAGS]=extData->ucm->ext->unicodeMask;

    /* write the extension data */
    udata_writeBlock(pData, indexes, sizeof(indexes));
    udata_writeBlock(pData, utm_getStart(extData->toUTable), indexes[UCNV_EXT_TO_U_LENGTH]*4);
    udata_writeBlock(pData, utm_getStart(extData->toUUChars), indexes[UCNV_EXT_TO_U_UCHARS_LENGTH]*2);

    udata_writeBlock(pData, utm_getStart(extData->fromUTableUChars), indexes[UCNV_EXT_FROM_U_LENGTH]*2);
    udata_writeBlock(pData, utm_getStart(extData->fromUTableValues), indexes[UCNV_EXT_FROM_U_LENGTH]*4);
    udata_writeBlock(pData, utm_getStart(extData->fromUBytes), indexes[UCNV_EXT_FROM_U_BYTES_LENGTH]);

    udata_writeBlock(pData, extData->stage1, extData->stage1Top*2);
    udata_writeBlock(pData, extData->stage2, extData->stage2Top*2);
    udata_writeBlock(pData, extData->stage3, extData->stage3Top*2);
    udata_writeBlock(pData, extData->stage3b, extData->stage3bTop*4);

#if 0
    {
        int32_t i, j;

        length=extData->stage1Top;
        printf("\nstage1[%x]:\n", length);

        for(i=0; i<length; ++i) {
            if(extData->stage1[i]!=length) {
                printf("stage1[%04x]=%04x\n", i, extData->stage1[i]);
            }
        }

        j=length;
        length=extData->stage2Top;
        printf("\nstage2[%x]:\n", length);

        for(i=0; i<length; ++j, ++i) {
            if(extData->stage2[i]!=0) {
                printf("stage12[%04x]=%04x\n", j, extData->stage2[i]);
            }
        }

        length=extData->stage3Top;
        printf("\nstage3[%x]:\n", length);

        for(i=0; i<length; ++i) {
            if(extData->stage3[i]!=0) {
                printf("stage3[%04x]=%04x\n", i, extData->stage3[i]);
            }
        }

        length=extData->stage3bTop;
        printf("\nstage3b[%x]:\n", length);

        for(i=0; i<length; ++i) {
            if(extData->stage3b[i]!=0) {
                printf("stage3b[%04x]=%08x\n", i, extData->stage3b[i]);
            }
        }
    }
#endif

    if(VERBOSE) {
        printf("size of extension data: %ld\n", (long)top);
    }

    /* return the number of bytes that should have been written */
    return (uint32_t)(headerSize+top);
}